

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitMessageSendNode
          (MethodSemanticAnalysis *this,MessageSendNode *node)

{
  pointer ppMVar1;
  pointer ppNVar2;
  bool bVar3;
  int iVar4;
  CompilerOptimizedSelector selectorId;
  Node *pNVar5;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *pvVar6;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *pvVar7;
  Oop selector;
  int i;
  uint uVar8;
  MessageSendNode *this_00;
  Node **arg;
  pointer ppNVar9;
  
  pNVar5 = AST::MessageSendNode::getReceiver(node);
  iVar4 = (*pNVar5->_vptr_Node[7])(pNVar5);
  pvVar6 = AST::MessageSendNode::getChainedMessages(node);
  if (((char)iVar4 == '\0') &&
     ((pvVar6->
      super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (pvVar6->
      super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    selector = AST::MessageSendNode::getSelectorOop(node);
    selectorId = VMContext::getCompilerOptimizedSelectorId
                           ((this->super_ScopedInterpreter).context,selector);
    if ((selectorId != Invalid) && (bVar3 = optimizeMessage(this,node,selectorId), bVar3)) {
      return (Oop)&NilObject;
    }
  }
  pNVar5 = AST::MessageSendNode::getReceiver(node);
  (*pNVar5->_vptr_Node[2])(pNVar5,this);
  for (uVar8 = 0xffffffff;
      ppMVar1 = (pvVar6->
                super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
      (int)uVar8 <
      (int)((ulong)((long)(pvVar6->
                          super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3);
      uVar8 = uVar8 + 1) {
    this_00 = node;
    if (-1 < (int)uVar8) {
      this_00 = ppMVar1[uVar8];
    }
    pvVar7 = AST::MessageSendNode::getArguments(this_00);
    ppNVar2 = (pvVar7->
              super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppNVar9 = (pvVar7->
                   super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
                   _M_impl.super__Vector_impl_data._M_start; ppNVar9 != ppNVar2;
        ppNVar9 = ppNVar9 + 1) {
      (*(*ppNVar9)->_vptr_Node[2])(*ppNVar9,this);
    }
  }
  return (Oop)&NilObject;
}

Assistant:

Oop MethodSemanticAnalysis::visitMessageSendNode(MessageSendNode *node)
{
    auto isSuperSend = node->getReceiver()->isSuperReference();

	// Visit the arguments in reverse order.
	auto &chained = node->getChainedMessages();

    // Only try to optimize some message when they aren't in a chain.
    if(!isSuperSend && chained.empty())
    {
        auto selector = node->getSelectorOop();

        // If this is an optimized message, implement inlined.
        auto optimizedSelector = context->getCompilerOptimizedSelectorId(selector);
        if(optimizedSelector != CompilerOptimizedSelector::Invalid)
        {
            if(optimizeMessage(node, optimizedSelector))
                return Oop();
        }
    }

    // Visit the receiver.
	node->getReceiver()->acceptVisitor(this);

	// Send each message in the chain
	for(int i = -1; i < (int)chained.size(); ++i)
	{
		auto message = i < 0 ? node : chained[i];

		// Visit the arguments.
		auto &arguments = message->getArguments();
		for(auto &arg : arguments)
			arg->acceptVisitor(this);
	}

	return Oop();
}